

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParserTest.cpp
# Opt level: O1

void __thiscall
ODDLParser::OpenDDLParserTest_accessBufferTest_Test::TestBody
          (OpenDDLParserTest_accessBufferTest_Test *this)

{
  ulong uVar1;
  bool bVar2;
  size_t i;
  char *buffer;
  long lVar3;
  char *pcVar4;
  size_t sVar5;
  ulong uVar6;
  char *in_R9;
  internal iVar7;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  OpenDDLParser myParser;
  AssertHelper local_b8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  AssertHelper local_a0;
  string local_98;
  OpenDDLParser local_78;
  
  buffer = (char *)operator_new__(100);
  lVar3 = 0;
  do {
    buffer[lVar3] = (char)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 100);
  OpenDDLParser::OpenDDLParser(&local_78);
  OpenDDLParser::setBuffer(&local_78,buffer,100);
  local_b0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       OpenDDLParser::getBufferSize(&local_78);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_98,"len","myParser.getBufferSize()",&TestBody::len,
             (unsigned_long *)&local_b0);
  if ((char)local_98._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_b0);
    if ((undefined8 *)local_98._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_98._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0xb0,pcVar4);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    if (local_b0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_b0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_b0.ptr_ + 8))();
      }
      local_b0.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_98._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pcVar4 = OpenDDLParser::getBuffer(&local_78);
  uVar1 = 0;
  do {
    uVar6 = uVar1;
    sVar5 = OpenDDLParser::getBufferSize(&local_78);
    if ((100 < uVar6) || (sVar5 <= uVar6)) break;
    uVar1 = uVar6 + 1;
  } while (buffer[uVar6] == pcVar4[uVar6]);
  iVar7 = (internal)(sVar5 <= uVar6);
  local_a8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_b0.ptr_._0_1_ = iVar7;
  if (!(bool)iVar7) {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&local_b0,(AssertionResult *)"equal","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0xbd,(char *)CONCAT71(local_98._M_dataplus._M_p._1_7_,
                                      (char)local_98._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_98._M_dataplus._M_p._1_7_,(char)local_98._M_dataplus._M_p) !=
        &local_98.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_98._M_dataplus._M_p._1_7_,(char)local_98._M_dataplus._M_p),
                      local_98.field_2._M_allocated_capacity + 1);
    }
    if (local_b8.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_b8.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_b8.data_ + 8))();
      }
      local_b8.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_a8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  OpenDDLParser::clear(&local_78);
  buffer[1] = 'c';
  local_b0.ptr_._0_1_ = (internal)0x1;
  local_a8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_a8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  OpenDDLParser::setBuffer(&local_78,buffer,100);
  OpenDDLParser::clear(&local_78);
  local_b8.data_ = local_b8.data_ & 0xffffffff00000000;
  local_b0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       OpenDDLParser::getBufferSize(&local_78);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&local_98,"0U","myParser.getBufferSize()",(uint *)&local_b8,
             (unsigned_long *)&local_b0);
  if ((char)local_98._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_b0);
    if ((undefined8 *)local_98._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_98._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0xca,pcVar4);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    if (local_b0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_b0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_b0.ptr_ + 8))();
      }
      local_b0.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_98._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_b0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       OpenDDLParser::getBuffer(&local_78);
  local_b8.data_ = (AssertHelperData *)0x0;
  testing::internal::CmpHelperEQ<char_const*,char_const*>
            ((internal *)&local_98,"nullptr","myParser.getBuffer()",(char **)&local_b8,
             (char **)&local_b0);
  if ((char)local_98._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_b0);
    if ((undefined8 *)local_98._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_98._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0xcb,pcVar4);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    if (local_b0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_b0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_b0.ptr_ + 8))();
      }
      local_b0.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_98._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  operator_delete__(buffer);
  OpenDDLParser::~OpenDDLParser(&local_78);
  return;
}

Assistant:

TEST_F(OpenDDLParserTest, accessBufferTest) {
    static const size_t len = 100;
    char *buffer = new char[len];
    for (size_t i = 0; i < len; i++) {
        buffer[i] = (char)i;
    }
    OpenDDLParser myParser;
    myParser.setBuffer(buffer, len);
    EXPECT_EQ(len, myParser.getBufferSize());
    bool equal(true);
    const char *parserBuffer(myParser.getBuffer());
    for (size_t i = 0; i < myParser.getBufferSize(); i++) {
        if (i > len) {
            equal = false;
            break;
        }
        if (buffer[i] != parserBuffer[i]) {
            equal = false;
            break;
        }
    }
    EXPECT_TRUE(equal);

    bool success(true);
    try {
        myParser.clear();
        buffer[1] = 'c';
    } catch (...) {
        success = false;
    }
    EXPECT_TRUE(success);

    myParser.setBuffer(buffer, len);
    myParser.clear();
    EXPECT_EQ(0U, myParser.getBufferSize());
    EXPECT_EQ(nullptr, myParser.getBuffer());
    delete[] buffer;
}